

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O3

bool crnlib::image_utils::read_from_stream_stb(data_stream_serializer *serializer,image_u8 *img)

{
  uchar *puVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uint uVar5;
  color_quad<unsigned_char,_int> *pcVar6;
  uint new_width;
  bool bVar7;
  void *pvVar8;
  void *pvVar9;
  byte bVar10;
  bool bVar11;
  int iVar12;
  stbi__result_info *in_R9;
  ulong uVar13;
  uchar uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long in_FS_OFFSET;
  int y;
  int x;
  int n;
  uint8_vec buf;
  uint uVar18;
  uint local_164;
  image_u8 *local_160;
  int local_154;
  void *local_150;
  vector<unsigned_char> local_148;
  long local_130;
  ulong local_128;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_120;
  int local_11c [3];
  stbi__context local_110;
  
  local_148.m_p = (uchar *)0x0;
  local_148.m_size = 0;
  local_148.m_capacity = 0;
  local_160 = img;
  bVar7 = data_stream::read_array(serializer->m_pStream,&local_148);
  bVar11 = false;
  if (!bVar7) goto LAB_00118b3c;
  local_164 = 0;
  uVar18 = 0;
  local_154 = 0;
  local_110.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_110.read_from_callbacks = 0;
  local_110.callback_already_read = 0;
  local_110.img_buffer_original = local_148.m_p;
  local_110.img_buffer = local_148.m_p;
  local_110.img_buffer_end = local_148.m_p + (int)local_148.m_size;
  local_110.img_buffer_original_end = local_110.img_buffer_end;
  pvVar8 = stbi__load_main(&local_110,(int *)&local_164,(int *)&stack0xfffffffffffffe98,&local_154,
                           (int)local_11c,in_R9,0);
  new_width = local_164;
  if (pvVar8 != (void *)0x0) {
    if (local_11c[0] == 0x10) {
      iVar15 = local_164 * uVar18;
      uVar16 = iVar15 * 4;
      pvVar9 = malloc((long)(int)uVar16);
      if (pvVar9 == (void *)0x0) {
        *(char **)(in_FS_OFFSET + -8) = "outofmem";
        goto LAB_00118b07;
      }
      if (0 < iVar15 * 4) {
        uVar13 = 0;
        do {
          *(undefined1 *)((long)pvVar9 + uVar13) = *(undefined1 *)((long)pvVar8 + uVar13 * 2 + 1);
          uVar13 = uVar13 + 1;
        } while (uVar16 != uVar13);
      }
      free(pvVar8);
      pvVar8 = pvVar9;
    }
    else if (local_11c[0] != 8) {
      __assert_fail("ri.bits_per_channel == 8 || ri.bits_per_channel == 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/stb/stb_image.h"
                    ,0x4b9,
                    "unsigned char *stbi__load_and_postprocess_8bit(stbi__context *, int *, int *, int *, int)"
                   );
    }
    iVar15 = local_154;
    if ((int)uVar18 < 0x4001 && (int)new_width < 0x4001) {
      local_120.m_u32 = 0xff000000;
      local_150 = pvVar8;
      image<crnlib::color_quad<unsigned_char,_int>_>::resize
                (local_160,new_width,uVar18,0xffffffff,
                 (color_quad<unsigned_char,_int> *)&local_120.field_0);
      if ((int)uVar18 < 1) {
        uVar18 = 0x1f;
      }
      else {
        local_130 = (long)(int)new_width;
        local_128 = (ulong)uVar18;
        bVar10 = 1;
        iVar12 = 0;
        uVar13 = 0;
        pvVar8 = local_150;
        do {
          if (new_width != 0) {
            uVar5 = local_160->m_pitch;
            pcVar6 = local_160->m_pPixels;
            lVar17 = 0;
            do {
              uVar14 = *(uchar *)((long)pvVar8 + lVar17 + 3);
              if ((iVar15 != 2) && (iVar15 != 4)) {
                uVar14 = 0xff;
              }
              puVar1 = pcVar6[uVar5 * iVar12].field_0.c + lVar17;
              uVar2 = *(uchar *)((long)pvVar8 + lVar17);
              uVar3 = *(uchar *)((long)pvVar8 + lVar17 + 1);
              uVar4 = *(uchar *)((long)pvVar8 + lVar17 + 2);
              *puVar1 = uVar2;
              puVar1[1] = uVar3;
              bVar10 = bVar10 & (uVar3 == uVar4 && uVar2 == uVar3);
              puVar1[2] = uVar4;
              puVar1[3] = uVar14;
              lVar17 = lVar17 + 4;
            } while ((color_quad<unsigned_char,_int> *)(puVar1 + 4) !=
                     pcVar6 + (ulong)((int)uVar13 * uVar5) + local_130);
          }
          uVar13 = uVar13 + 1;
          iVar12 = iVar12 + 1;
          pvVar8 = (void *)((long)pvVar8 + local_130 * 4);
        } while (uVar13 != local_128);
        uVar18 = (uint)bVar10 << 4 | 0xf;
      }
      free(local_150);
      local_160->m_comp_flags = uVar18;
      if ((iVar15 != 2) && (iVar15 != 4)) {
        uVar18 = uVar18 & 0xfffffff7;
      }
      local_160->m_comp_flags = uVar18;
      bVar11 = true;
      goto LAB_00118b3c;
    }
    free(pvVar8);
  }
LAB_00118b07:
  bVar11 = false;
LAB_00118b3c:
  if (local_148.m_p != (uchar *)0x0) {
    crnlib_free(local_148.m_p);
  }
  return bVar11;
}

Assistant:

bool read_from_stream_stb(data_stream_serializer& serializer, image_u8& img)
        {
            uint8_vec buf;
            if (!serializer.read_entire_file(buf))
            {
                return false;
            }

            int x = 0, y = 0, n = 0;
            unsigned char* pData = stbi_load_from_memory(buf.get_ptr(), buf.size_in_bytes(), &x, &y, &n, 4);

            if (!pData)
            {
                return false;
            }

            if ((x > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION) || (y > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION))
            {
                stbi_image_free(pData);
                return false;
            }

            const bool has_alpha = ((n == 2) || (n == 4));

            img.resize(x, y);

            bool grayscale = true;

            for (int py = 0; py < y; py++)
            {
                const color_quad_u8* pSrc = reinterpret_cast<const color_quad_u8*>(pData) + (py * x);
                color_quad_u8* pDst = img.get_scanline(py);
                color_quad_u8* pDst_end = pDst + x;

                while (pDst != pDst_end)
                {
                    color_quad_u8 c(*pSrc++);
                    if (!has_alpha)
                    {
                        c.a = 255;
                    }

                    if (!c.is_grayscale())
                    {
                        grayscale = false;
                    }

                    *pDst++ = c;
                }
            }

            stbi_image_free(pData);

            img.reset_comp_flags();
            img.set_grayscale(grayscale);
            img.set_component_valid(3, has_alpha);

            return true;
        }